

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::InsertionOrderIndex>::insert
          (Table<unsigned_int,_kj::InsertionOrderIndex> *this,StringPtr *row)

{
  long lVar1;
  StringPtr *pSVar2;
  size_t newSize;
  InsertionOrderIndex local_28;
  
  InsertionOrderIndex::insertImpl(&local_28,(size_t)(this + 0x20));
  if ((char)local_28.capacity != '\x01') {
    lVar1 = *(long *)(this + 0x10);
    if (*(long *)(this + 8) == lVar1) {
      newSize = 4;
      if (lVar1 != *(long *)this) {
        newSize = lVar1 - *(long *)this >> 1;
      }
      Vector<unsigned_int>::setCapacity((Vector<unsigned_int> *)this,newSize);
    }
    pSVar2 = *(StringPtr **)(this + 8);
    *(undefined4 *)&(pSVar2->content).ptr = *(undefined4 *)&(row->content).ptr;
    *(undefined1 **)(this + 8) = (undefined1 *)((long)&(pSVar2->content).ptr + 4);
    return pSVar2;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}